

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_impl.cpp
# Opt level: O3

void __thiscall gamespace::GameScreenImpl::createContextForLookAt(GameScreenImpl *this)

{
  ulong uVar1;
  Unit *pUVar2;
  pointer plVar3;
  long lVar4;
  Context *pCVar5;
  dvec2 mp;
  int iVar6;
  UI *dui;
  iterator __end2;
  layer_t *c;
  pointer plVar7;
  CoordinateMenu *this_00;
  BoardTile *b;
  bool bVar8;
  vec2 res;
  undefined1 auVar9 [16];
  dvec2 r;
  long *local_50;
  double local_48;
  long local_40 [2];
  
  this_00 = (CoordinateMenu *)(this->_selection).hovering;
  if ((this_00 != (CoordinateMenu *)0x0) &&
     (pUVar2 = (Unit *)this_00->_vptr_CoordinateMenu, pUVar2 != (Unit *)0x0)) {
    b = (BoardTile *)
        (this->_ui)._M_t.super___uniq_ptr_impl<ui::UI,_std::default_delete<ui::UI>_>._M_t.
        super__Tuple_impl<0UL,_ui::UI_*,_std::default_delete<ui::UI>_>.
        super__Head_base<0UL,_ui::UI_*,_false>._M_head_impl;
    plVar7 = *(pointer *)
              &((vector<ui::layer_t,_std::allocator<ui::layer_t>_> *)&b->_unit)->
               super__Vector_base<ui::layer_t,_std::allocator<ui::layer_t>_>;
    plVar3 = *(pointer *)
              &((vector<ui::layer_t,_std::allocator<ui::layer_t>_> *)&b->_board)->
               super__Vector_base<ui::layer_t,_std::allocator<ui::layer_t>_>;
    if (plVar7 != plVar3) {
      do {
        lVar4 = *(long *)&(plVar7->name)._M_dataplus;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,lVar4,(plVar7->name)._M_string_length + lVar4);
        lVar4 = *(long *)((long)(plVar7->layer)._M_t.
                                super___uniq_ptr_impl<ui::Renderable,_std::default_delete<ui::Renderable>_>
                         + 0x90);
        iVar6 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar6 == 0) {
          bVar8 = *(Unit **)(lVar4 + 0x50) == pUVar2;
        }
        else {
          bVar8 = false;
        }
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if (bVar8) {
          return;
        }
        plVar7 = plVar7 + 1;
      } while (plVar7 != plVar3);
      b = (BoardTile *)
          (this->_ui)._M_t.super___uniq_ptr_impl<ui::UI,_std::default_delete<ui::UI>_>._M_t.
          super__Tuple_impl<0UL,_ui::UI_*,_std::default_delete<ui::UI>_>.
          super__Head_base<0UL,_ui::UI_*,_false>._M_head_impl;
      this_00 = (CoordinateMenu *)(this->_selection).hovering;
    }
    pCVar5 = this->_ctxt;
    uVar1._0_4_ = pCVar5->_w;
    uVar1._4_4_ = pCVar5->_h;
    auVar9._0_8_ = uVar1 & 0xffffffff;
    auVar9._8_4_ = uVar1._4_4_;
    auVar9._12_4_ = 0;
    res.field_0._0_4_ = (float)(SUB168(auVar9 | _DAT_001b91b0,0) - (double)DAT_001b91b0);
    res.field_0._4_4_ = (float)(SUB168(auVar9 | _DAT_001b91b0,8) - DAT_001b91b0._8_8_);
    glfwGetCursorPos(pCVar5->_window,(double *)&local_50,&local_48);
    mp.field_0.field_0.y = local_48;
    mp.field_0.field_0.x = (double)local_50;
    CoordinateMenu::createForTile(this_00,b,dui,res,mp);
  }
  return;
}

Assistant:

void GameScreenImpl::createContextForLookAt() {
    if(_selection.hovering == nullptr) return;
    auto *u = _selection.hovering->unit();
    if(u && _ui->hasModelMatching([u](std::string name, void *m){return name == "unitctxt" && ((CoordinateMenu*)m)->unit() == u;}) == false)
        CoordinateMenu::createForTile(_selection.hovering, _ui.get(), _ctxt->getResolution(), _ctxt->getMousePos());
}